

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  REF_MPI ref_mpi;
  uint uVar1;
  uint uVar2;
  void *__s;
  void *output;
  clock_t cVar3;
  int iVar4;
  REF_STATUS RVar5;
  undefined8 uVar6;
  REF_STATUS ref_private_macro_code_rxs;
  uint uVar7;
  void *pvVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  REF_INT local;
  double local_100;
  long local_f8;
  double local_c0;
  double local_b8;
  long local_b0;
  uint local_a8;
  int local_a4;
  long local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  undefined8 *local_80;
  ulong local_78;
  void *local_70;
  long local_68;
  ulong local_60;
  size_t local_58;
  long local_50;
  size_t local_48;
  REF_DBL *local_40;
  size_t local_38;
  
  ref_mpi = ref_node->ref_mpi;
  lVar17 = ref_node->old_n_global;
  uVar7 = (int)(lVar17 / (long)ref_mpi->n) + 1;
  uVar1 = uVar7;
  if ((0 < ref_mpi->reduce_byte_limit) &&
     (uVar1 = ref_mpi->reduce_byte_limit / (ldim * 8 + 8), (int)uVar7 < (int)uVar1)) {
    uVar1 = uVar7;
  }
  uVar7 = ldim + 1;
  uVar15 = uVar1 * uVar7;
  if ((int)uVar15 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x67d,
           "ref_gather_node_scalar_bin","malloc local_xyzm of REF_DBL negative");
LAB_0012bf7f:
    RVar5 = 1;
  }
  else {
    sVar9 = (ulong)uVar15 << 3;
    local_40 = scalar;
    __s = malloc(sVar9);
    if (__s == (void *)0x0) {
      pcVar12 = "malloc local_xyzm of REF_DBL NULL";
      uVar6 = 0x67d;
    }
    else {
      local_58 = sVar9;
      output = malloc(sVar9);
      if (output != (void *)0x0) {
        if (lVar17 < 1) {
          uVar16 = 0;
          local_b8 = 0.0;
          local_100 = 0.0;
          local_c0 = 0.0;
        }
        else {
          local_98 = (long)(int)uVar1;
          local_38 = (ulong)uVar7 << 3;
          local_48 = (ulong)(uint)ldim * 8;
          local_50 = (long)ldim;
          local_80 = (undefined8 *)((long)__s + local_50 * 8);
          local_70 = (void *)((long)output + local_50 * 8);
          uVar16 = 0;
          lVar11 = 0;
          local_b0 = 0;
          local_a0 = 0;
          local_88 = 0;
          local_f8 = 0;
          local_90 = (ulong)uVar1;
          local_78 = (ulong)(uint)ldim;
          local_68 = (long)(int)uVar7;
          do {
            uVar10 = lVar17 - lVar11;
            if (local_98 < lVar17 - lVar11) {
              uVar10 = local_90;
            }
            if (1 < ref_mpi->timing) {
              local_f8 = clock();
            }
            iVar4 = (int)uVar10;
            if (uVar15 != 0) {
              memset(__s,0,local_58);
            }
            uVar10 = uVar10 & 0xffffffff;
            local_60 = uVar10;
            if (0 < iVar4) {
              uVar1 = 0;
              puVar13 = local_80;
              lVar17 = lVar11;
              do {
                uVar2 = ref_node_local(ref_node,lVar17,&local_a4);
                if ((uVar2 != 0) && (uVar2 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x68f,"ref_gather_node_scalar_bin",(ulong)uVar2,"node local failed");
                  local_a8 = uVar2;
                }
                pvVar8 = (void *)((long)__s + (ulong)uVar1 * 8);
                if (uVar2 == 5) {
LAB_0012bd45:
                  if (-1 < ldim) {
                    memset(pvVar8,0,local_38);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return local_a8;
                  }
                  if (ref_mpi->id != ref_node->part[local_a4]) goto LAB_0012bd45;
                  if (0 < ldim) {
                    memcpy(pvVar8,local_40 + local_a4 * local_50,local_48);
                  }
                  *puVar13 = 0x3ff0000000000000;
                }
                uVar1 = uVar1 + uVar7;
                puVar13 = puVar13 + (int)uVar7;
                lVar17 = lVar17 + 1;
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
            }
            if (1 < ref_mpi->timing) {
              cVar3 = clock();
              local_88 = local_88 + (cVar3 - local_f8);
              if (1 < ref_mpi->timing) {
                local_f8 = clock();
              }
            }
            uVar1 = ref_mpi_sum(ref_mpi,__s,output,iVar4 * uVar7,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x69e,"ref_gather_node_scalar_bin",(ulong)uVar1,"sum");
              return uVar1;
            }
            if (1 < ref_mpi->timing) {
              cVar3 = clock();
              local_a0 = local_a0 + (cVar3 - local_f8);
              if (1 < ref_mpi->timing) {
                local_f8 = clock();
              }
            }
            if ((ref_mpi->id == 0) && (0 < iVar4)) {
              uVar1 = 0;
              uVar10 = 0;
              do {
                dVar18 = *(double *)((long)local_70 + uVar10 * local_68 * 8) + -1.0;
                if (dVar18 <= -dVar18) {
                  dVar18 = -dVar18;
                }
                if (0.1 < dVar18) {
                  printf("error gather node %ld %f\n",lVar11 + uVar10);
                }
                if (0 < ldim) {
                  pvVar8 = (void *)((long)output + (ulong)uVar1 * 8);
                  uVar14 = local_78;
                  do {
                    sVar9 = fwrite(pvVar8,8,1,(FILE *)file);
                    if (sVar9 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x6ab,"ref_gather_node_scalar_bin","s",1,sVar9);
                      goto LAB_0012bf7f;
                    }
                    pvVar8 = (void *)((long)pvVar8 + 8);
                    uVar14 = uVar14 - 1;
                  } while (uVar14 != 0);
                }
                uVar10 = uVar10 + 1;
                uVar1 = uVar1 + uVar7;
              } while (uVar10 != local_60);
            }
            if (1 < ref_mpi->timing) {
              cVar3 = clock();
              local_b0 = (local_b0 - local_f8) + cVar3;
            }
            uVar1 = (uint)local_90;
            uVar16 = (ulong)((int)uVar16 + 1);
            lVar11 = lVar11 + iVar4;
            lVar17 = ref_node->old_n_global;
          } while (lVar11 < lVar17);
          local_b8 = (double)local_88;
          local_100 = (double)local_a0;
          local_c0 = (double)local_b0;
        }
        free(output);
        free(__s);
        if (1 < ref_mpi->timing) {
          printf(" local %f mpi %f disk %f rank %d\n",local_b8 / 1000000.0,local_100 / 1000000.0,
                 local_c0 / 1000000.0,(ulong)(uint)ref_mpi->id);
        }
        if (ref_mpi->reduce_byte_limit < 1) {
          uVar7 = 0x7fffffff;
        }
        else {
          uVar7 = ref_mpi->reduce_byte_limit / (int)(uVar7 * 8);
        }
        if (uVar1 != uVar7) {
          return 0;
        }
        if (ref_mpi->id != 0) {
          return 0;
        }
        printf("mpi reduce limited to %d chunks of %d bytes\n",uVar16,(ulong)(uVar15 * 8));
        return 0;
      }
      pcVar12 = "malloc xyzm of REF_DBL NULL";
      uVar6 = 0x67e;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
           "ref_gather_node_scalar_bin",pcVar12);
    RVar5 = 2;
  }
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,
                                                     REF_INT ldim,
                                                     REF_DBL *scalar,
                                                     FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk, nchunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;
  clock_t tic = 0;
  clock_t local_toc = 0;
  clock_t mpi_toc = 0;
  clock_t disk_toc = 0;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (ldim + 1) * chunk, REF_DBL);

  nchunk = 0;
  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    nchunk++;
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;
    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    for (i = 0; i < (ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < ldim; im++)
          local_xyzm[im + (ldim + 1) * i] = scalar[im + ldim * local];
        local_xyzm[ldim + (ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (ldim + 1); im++)
          local_xyzm[im + (ldim + 1) * i] = 0.0;
      }
    }
    if (1 < ref_mpi_timing(ref_mpi)) local_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (ldim + 1) * n, REF_DBL_TYPE),
        "sum");
    if (1 < ref_mpi_timing(ref_mpi)) mpi_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[ldim + (ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[ldim + (ldim + 1) * i]);
        }
        for (im = 0; im < ldim; im++) {
          REIS(1,
               fwrite(&(xyzm[im + (ldim + 1) * i]), sizeof(REF_DBL), 1, file),
               "s");
        }
      }
    if (1 < ref_mpi_timing(ref_mpi)) disk_toc += (clock() - tic);
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  if (1 < ref_mpi_timing(ref_mpi)) {
    printf(" local %f mpi %f disk %f rank %d\n",
           ((REF_DBL)local_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)mpi_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)disk_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ref_mpi_rank(ref_mpi));
  }

  if (chunk == ref_mpi_reduce_chunk_limit(
                   ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL))) {
    if (ref_mpi_once(ref_mpi)) {
      printf("mpi reduce limited to %d chunks of %d bytes\n", nchunk,
             chunk * (ldim + 1) * (REF_INT)sizeof(REF_DBL));
    }
  }

  return REF_SUCCESS;
}